

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

void bidiag(double *A,int M,int N)

{
  size_t __size;
  int iVar1;
  int n;
  uint uVar2;
  long lVar3;
  double *x;
  double *v;
  double *A_00;
  double *C;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  double dVar22;
  long local_e8;
  double *local_e0;
  double *local_c8;
  ulong local_a0;
  long local_98;
  int local_78;
  int local_74;
  double *local_70;
  
  if (M < N) {
    printf("M should be greater than or equal to N");
    exit(1);
  }
  uVar20 = (ulong)(uint)N;
  lVar3 = (long)M;
  __size = lVar3 * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  lVar10 = (long)N;
  A_00 = (double *)malloc(__size * lVar10);
  C = (double *)malloc(__size * lVar3);
  uVar18 = 0;
  uVar11 = 0;
  if (0 < N) {
    uVar11 = uVar20;
  }
  uVar19 = (ulong)(uint)M;
  local_e8 = lVar10 << 0x20;
  local_78 = 2;
  iVar1 = -1;
  local_74 = 1;
  pdVar12 = x;
  local_e0 = v;
  local_c8 = A;
  local_a0 = uVar19;
  local_70 = A;
  local_98 = local_e8;
  while( true ) {
    local_98 = local_98 + -0x100000000;
    pdVar12 = pdVar12 + -1;
    uVar17 = (uint)uVar18;
    n = M - uVar17;
    uVar2 = uVar17;
    if (n != 0 && (int)uVar17 <= M) {
      uVar2 = M;
    }
    if (uVar18 == uVar11) break;
    lVar8 = (long)local_74;
    lVar4 = (ulong)(uint)(iVar1 + local_74) << 0x20;
    pdVar5 = (double *)(lVar10 * 8 * lVar8 + (long)local_c8);
    lVar16 = (long)local_78;
    pdVar7 = local_70;
    for (uVar9 = 0; local_a0 != uVar9; uVar9 = uVar9 + 1) {
      x[uVar9] = *pdVar7;
      pdVar7 = pdVar7 + lVar10;
    }
    dVar22 = house(x,M - uVar17,v);
    lVar6 = 0;
    pdVar7 = local_70;
    for (uVar9 = uVar18; uVar9 != uVar2; uVar9 = uVar9 + 1) {
      lVar13 = lVar6;
      for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
        *(double *)((long)A_00 + (lVar13 >> 0x1d)) = pdVar7[uVar14];
        lVar13 = lVar13 + (local_a0 << 0x20);
      }
      pdVar7 = pdVar7 + lVar10;
      lVar6 = lVar6 + 0x100000000;
    }
    iVar21 = N - uVar17;
    mmult(A_00,v,C,iVar21,n,1);
    scale(C,iVar21,1,dVar22);
    mmult(v,C,A_00,n,1,iVar21);
    lVar6 = 0;
    pdVar7 = local_70;
    for (uVar9 = uVar18; lVar13 = lVar8, uVar9 != uVar2; uVar9 = uVar9 + 1) {
      lVar13 = lVar6;
      for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
        pdVar7[uVar14] = pdVar7[uVar14] - *(double *)((long)A_00 + (lVar13 >> 0x1d));
        lVar13 = lVar13 + 0x100000000;
      }
      pdVar7 = pdVar7 + lVar10;
      lVar6 = lVar6 + local_e8;
    }
    for (; lVar13 < lVar3; lVar13 = lVar13 + 1) {
      *pdVar5 = local_e0[lVar13];
      pdVar5 = pdVar5 + lVar10;
    }
    lVar6 = lVar8;
    if ((long)uVar18 < (long)(N + -2)) {
      for (; lVar6 < lVar10; lVar6 = lVar6 + 1) {
        pdVar12[lVar6] = A[lVar6];
      }
      iVar21 = iVar21 + -1;
      dVar22 = house(x,iVar21,v);
      lVar6 = lVar4;
      pdVar7 = A;
      for (uVar9 = uVar18; lVar13 = lVar6, lVar15 = lVar8, uVar9 != uVar19; uVar9 = uVar9 + 1) {
        for (; lVar15 < lVar10; lVar15 = lVar15 + 1) {
          *(double *)((long)A_00 + (lVar13 >> 0x1d)) = pdVar7[lVar15];
          lVar13 = lVar13 + 0x100000000;
        }
        pdVar7 = pdVar7 + lVar10;
        lVar6 = lVar6 + local_98;
      }
      mmult(A_00,v,C,n,iVar21,1);
      scale(C,M - uVar17,1,dVar22);
      mmult(C,v,A_00,n,1,iVar21);
      pdVar7 = A;
      for (uVar9 = uVar18; lVar6 = lVar4, lVar13 = lVar8, pdVar5 = v, uVar9 != uVar19;
          uVar9 = uVar9 + 1) {
        for (; lVar13 < lVar10; lVar13 = lVar13 + 1) {
          pdVar7[lVar13] = pdVar7[lVar13] - *(double *)((long)A_00 + (lVar6 >> 0x1d));
          lVar6 = lVar6 + 0x100000000;
        }
        pdVar7 = pdVar7 + lVar10;
        lVar4 = lVar4 + local_98;
      }
      for (; lVar16 < lVar10; lVar16 = lVar16 + 1) {
        A[lVar16] = pdVar5[1];
        pdVar5 = pdVar5 + 1;
      }
    }
    uVar18 = uVar18 + 1;
    local_a0 = local_a0 - 1;
    local_74 = local_74 + 1;
    local_78 = local_78 + 1;
    local_70 = local_70 + lVar10 + 1;
    uVar20 = uVar20 - 1;
    local_e8 = local_e8 + -0x100000000;
    local_e0 = local_e0 + -1;
    local_c8 = local_c8 + 1;
    A = A + lVar10;
    iVar1 = iVar1 + -1;
  }
  free(x);
  free(v);
  free(A_00);
  return;
}

Assistant:

void bidiag(double *A, int M, int N) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);


	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}